

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall doctest::Context::setOption(Context *this,char *option,char *value)

{
  char *lvalue;
  String argv;
  bool in_stack_000001cf;
  char **in_stack_000001d0;
  int in_stack_000001dc;
  Context *in_stack_000001e0;
  String *in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff28;
  String *in_stack_ffffffffffffff30;
  String *in_stack_ffffffffffffff60;
  String *in_stack_ffffffffffffff68;
  
  String::String(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  String::String(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  operator+(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  String::String(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  operator+(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  String::String(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  operator+(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  String::~String(in_stack_ffffffffffffff30);
  String::~String(in_stack_ffffffffffffff30);
  String::~String(in_stack_ffffffffffffff30);
  String::~String(in_stack_ffffffffffffff30);
  String::~String(in_stack_ffffffffffffff30);
  String::~String(in_stack_ffffffffffffff30);
  String::c_str(in_stack_ffffffffffffff18);
  parseArgs(in_stack_000001e0,in_stack_000001dc,in_stack_000001d0,in_stack_000001cf);
  String::~String(in_stack_ffffffffffffff30);
  return;
}

Assistant:

void Context::setOption(const char* option, const char* value) {
    auto argv   = String("-") + option + "=" + value;
    auto lvalue = argv.c_str();
    parseArgs(1, &lvalue);
}